

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readTokenSkippingComments(OurReader *this,Token *token)

{
  bool bVar1;
  
  bVar1 = readToken(this,token);
  if (((this->features_).allowComments_ == true) && (bVar1 && token->type_ == tokenComment)) {
    do {
      bVar1 = readToken(this,token);
      if (!bVar1) {
        return bVar1;
      }
    } while (token->type_ == tokenComment);
  }
  return bVar1;
}

Assistant:

bool OurReader::readTokenSkippingComments(Token& token) {
  bool success = readToken(token);
  if (features_.allowComments_) {
    while (success && token.type_ == tokenComment) {
      success = readToken(token);
    }
  }
  return success;
}